

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void copy_structdecl(char *kind,char *name)

{
  byte bVar1;
  int lineno;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  char *line;
  FILE **ppFVar4;
  int iVar5;
  
  lineno = input_file->lineno;
  line = dup_line();
  pcVar3 = cptr;
  pcVar2 = ::line;
  if ((dflag != '\0') && (include_defines == '\0')) {
    fprintf((FILE *)text_file,"#include \"%s\"\n\n",defines_file_name);
    include_defines = '\x01';
  }
  if (dflag == '\0') {
    ppFVar4 = &text_file;
  }
  else {
    ppFVar4 = &union_file;
  }
  __stream = (FILE *)*ppFVar4;
  fputc(10,__stream);
  if (lflag == '\0') {
    fprintf(__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  iVar5 = 0;
  fprintf(__stream,"typedef %s",kind);
  do {
    while( true ) {
      while( true ) {
        bVar1 = *cptr;
        cptr = cptr + 1;
        putc((int)(char)bVar1,__stream);
        if (bVar1 < 0x27) break;
        if (bVar1 < 0x2f) {
          if (bVar1 == 0x27) goto LAB_00113880;
        }
        else if (bVar1 == 0x2f) {
          copy_comment((FILE *)__stream,(FILE *)0x0);
        }
        else if (bVar1 == 0x7b) {
          iVar5 = iVar5 + 1;
        }
        else if ((bVar1 == 0x7d) && (iVar5 = iVar5 + -1, iVar5 == 0)) {
          fprintf(__stream," %s;\n",name);
          free(line);
          fprintf(__stream,"#define %s %s\n",name,name);
          return;
        }
      }
      if (bVar1 == 10) break;
      if (bVar1 == 0x22) {
LAB_00113880:
        copy_string((int)(char)bVar1,(FILE *)__stream,(FILE *)0x0);
      }
    }
    get_line();
    if (::line == (char *)0x0) {
      unterminated_union(lineno,line,line + (long)(pcVar3 + (-6 - (long)pcVar2)));
    }
  } while( true );
}

Assistant:

void copy_structdecl(const char *kind, const char *name)
{
    FILE *dc_file;
    register int c;
    int depth;
    int u_lineno = input_file->lineno;
    char *u_line = dup_line();
    char *u_cptr = u_line + (cptr - line - 6);

    if (dflag && !include_defines) {
	fprintf(text_file, "#include \"%s\"\n\n", defines_file_name);
	include_defines = 1; }

    /* VM: Print to either code file or defines file but not to both */
    dc_file = dflag ? union_file : text_file;
    fprintf(dc_file, "\n");
    if (!lflag)
	fprintf(dc_file, line_format, input_file->lineno, input_file->name);
    fprintf(dc_file, "typedef %s", kind);
    depth = 0;
loop:
    c = *cptr++;
    putc(c, dc_file);
    switch (c) {
    case '\n':
      get_line();
      if (line == 0) unterminated_union(u_lineno, u_line, u_cptr);
      goto loop;
    case '{':
      ++depth;
      goto loop;
    case '}':
      if (--depth == 0) {
	fprintf(dc_file, " %s;\n", name);
	FREE(u_line);
	break; }
      goto loop;
    case '\'':
    case '"':
      copy_string(c, dc_file, 0);
      goto loop;
    case '/':
      copy_comment(dc_file, 0);
      goto loop;
    default:
      goto loop;
    }
    fprintf(dc_file, "#define %s %s\n", name, name);
}